

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surf.cc
# Opt level: O1

SatType __thiscall features::Surf::filter_dxx(Surf *this,int fs,int x,int y)

{
  element_type *peVar1;
  pointer plVar2;
  int iVar3;
  int iVar4;
  
  peVar1 = (this->sat).super___shared_ptr<core::Image<long>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar3 = (peVar1->super_TypedImageBase<long>).super_ImageBase.w;
  iVar4 = ((~fs + x) - fs / 2) + (y - fs) * iVar3;
  iVar3 = (fs * 2 + -1) * iVar3 + iVar4;
  plVar2 = (peVar1->super_TypedImageBase<long>).data.super__Vector_base<long,_std::allocator<long>_>
           ._M_impl.super__Vector_impl_data._M_start;
  return (((plVar2[iVar4 + fs * 2] + plVar2[fs + iVar3]) * 3 + plVar2[iVar4]) -
         (plVar2[iVar4 + fs] + plVar2[iVar4 + fs * 3] + plVar2[iVar3] + plVar2[iVar3 + fs * 2])) +
         plVar2[fs * 3 + iVar3] + plVar2[iVar4 + fs] * -2 + plVar2[iVar3 + fs * 2] * -2;
}

Assistant:

Surf::SatType
Surf::filter_dxx (int fs, int x, int y)
{
    int const w = this->sat->width();
    int const fs2 = fs / 2;
    int const row1 = (x - fs - fs2 - 1) + w * (y - fs);
    int const row2 = row1 + w * (fs + fs - 1);

    Surf::SatType const v0 = this->sat->at(row1);
    Surf::SatType const v1 = this->sat->at(row1 + fs);
    Surf::SatType const v2 = this->sat->at(row1 + 2 * fs);
    Surf::SatType const v3 = this->sat->at(row1 + 3 * fs);
    Surf::SatType const v4 = this->sat->at(row2);
    Surf::SatType const v5 = this->sat->at(row2 + fs);
    Surf::SatType const v6 = this->sat->at(row2 + 2 * fs);
    Surf::SatType const v7 = this->sat->at(row2 + 3 * fs);

    Surf::SatType ret = 0;
    ret += v5 + v0 - v4 - v1;
    ret -= 2 * (v6 + v1 - v5 - v2);
    ret += v7 + v2 - v6 - v3;
    return ret;
}